

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetAccessors
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *getter,Var *setter)

{
  ScriptContext *this_00;
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  PropertyRecord *pPVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Var pvVar9;
  _func_int **pp_Var10;
  int local_54;
  PropertyRecord *pPStack_50;
  int i;
  PropertyRecord *propertyRecord;
  Var *local_40;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)setter;
  local_40 = getter;
  if (getter == (Var *)0x0 || setter == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x622,"(nullptr != getter && nullptr != setter)",
                                "Getter/Setter must be a valid pointer");
    if (!bVar5) goto LAB_00d9c3b8;
    *puVar8 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x624,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) {
LAB_00d9c3b8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pPStack_50 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&stack0xffffffffffffffb0,&local_38,&local_54);
  if (bVar5) {
    if ((local_38->Attributes & 8) != 0) {
      return 0;
    }
    iVar6 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(local_38);
    if (iVar6 == -1) {
      iVar6 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(local_38);
      bVar5 = iVar6 != -1;
      if (bVar5) {
        iVar6 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(local_38);
        pvVar9 = DynamicObject::GetSlot(instance,iVar6);
        *local_40 = pvVar9;
        (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
      }
      pPVar4 = propertyRecord;
      iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(local_38);
      if (iVar6 != -1) {
        iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(local_38);
        pp_Var10 = (_func_int **)DynamicObject::GetSlot(instance,iVar6);
        (pPVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
             = pp_Var10;
        bVar3 = !bVar5;
        bVar5 = true;
        if (bVar3) {
          *local_40 = (Var)0x0;
        }
      }
      return (uint)bVar5;
    }
  }
  BVar7 = 0;
  if (pPStack_50->isNumeric == true) {
    bVar5 = DynamicObject::HasObjectArray(instance);
    plVar1 = *(long **)&(instance->field_1).field_1;
    if (plVar1 != (long *)0x0 && bVar5) {
      BVar7 = (**(code **)(*plVar1 + 0xa8))(plVar1,propertyId,local_40,propertyRecord,this_00);
    }
  }
  return BVar7;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        AssertMsg(nullptr != getter && nullptr != setter, "Getter/Setter must be a valid pointer");

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (descriptor->template GetDataPropertyIndex<false>() == NoSlots)
            {
                bool getset = false;
                if (descriptor->GetGetterPropertyIndex() != NoSlots)
                {
                    *getter = instance->GetSlot(descriptor->GetGetterPropertyIndex());
                    *setter = nullptr;
                    getset = true;
                }
                if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    *setter = instance->GetSlot(descriptor->GetSetterPropertyIndex());
                    if(!getset) {
                        // if we didn't set the getter above, we need to set it here
                        *getter = nullptr;
                    }
                    getset = true;
                }
                return getset;
            }
        }

        // Check numeric propertyRecord only if objectArray available
        if (propertyRecord->IsNumeric())
        {
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray != nullptr)
            {
                return objectArray->GetAccessors(propertyId, getter, setter, scriptContext);
            }
        }

        return false;
    }